

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imu-elastic-local-frame-dynamical-system.cpp
# Opt level: O1

void __thiscall
stateObservation::flexibilityEstimation::IMUElasticLocalFrameDynamicalSystem::iterateDynamicsEuler
          (IMUElasticLocalFrameDynamicalSystem *this,Vector3 *positionCom,Vector3 *velocityCom,
          Vector3 *accelerationCom,Vector3 *AngMomentum,Vector3 *dotAngMomentum,Matrix3 *inertia,
          Matrix3 *dotInertia,IndexedVectorArray *contactPos,IndexedVectorArray *contactOri,
          Vector3 *position,Vector3 *linVelocity,Vector *fc,Vector3 *oriVector,Vector3 *angularVel,
          Vector *tc,Vector3 *fm,Vector3 *tm,Vector3 *addiForces,Vector3 *addiMoments,double dt)

{
  double *pdVar1;
  Matrix3 *mat;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  long lVar8;
  invalid_argument *this_00;
  SrcEvaluatorType srcEvaluator;
  ActualDstType actualDst;
  ActualDstType actualDst_1;
  ActualDstType actualDst_3;
  undefined4 in_XMM0_Dc;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 in_XMM0_Dd;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar9 [16];
  undefined4 uVar10;
  undefined4 uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double adStack_5e0 [138];
  undefined8 uStack_190;
  Matrix3 *pMStack_188;
  Matrix3 *pMStack_180;
  IndexedVectorArray *pIStack_178;
  IndexedVectorArray *pIStack_170;
  Vector3 *pVStack_168;
  Vector3 *pVStack_160;
  Vector3 *pVStack_158;
  Vector3 *pVStack_150;
  Matrix3 *pMStack_148;
  Vector3 *pVStack_140;
  Vector3 *pVStack_138;
  Vector *pVStack_130;
  Vector3 *pVStack_128;
  Vector3 *pVStack_120;
  Matrix3 *pMStack_118;
  Vector3 *pVStack_110;
  Vector3 *pVStack_108;
  Vector *pVStack_100;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  Vector3 *local_a8;
  double dStack_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  type tmp;
  
  local_98._8_4_ = in_XMM0_Dc;
  local_98._0_8_ = dt;
  local_98._12_4_ = in_XMM0_Dd;
  dVar2 = (this->op_).orientationVector0.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0];
  if ((((dVar2 == (oriVector->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                  m_storage.m_data.array[0]) &&
       (!NAN(dVar2) &&
        !NAN((oriVector->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
             m_data.array[0]))) &&
      (dVar2 = (this->op_).orientationVector0.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
               [1],
      pdVar1 = (oriVector->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array + 1, dVar2 == *pdVar1)) && (!NAN(dVar2) && !NAN(*pdVar1))) {
    dVar2 = (this->op_).orientationVector0.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
    pdVar1 = (oriVector->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
             m_data.array + 2;
    if ((dVar2 == *pdVar1) && (!NAN(dVar2) && !NAN(*pdVar1))) goto LAB_0015d4cf;
  }
  dVar2 = (oriVector->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
          .array[1];
  (this->op_).orientationVector0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
  m_storage.m_data.array[0] =
       (oriVector->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[0];
  (this->op_).orientationVector0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
  m_storage.m_data.array[1] = dVar2;
  (this->op_).orientationVector0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
  m_storage.m_data.array[2] =
       (oriVector->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[2];
  dVar12 = (oriVector->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
           m_data.array[0];
  dVar13 = (oriVector->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
           m_data.array[1];
  dVar2 = (oriVector->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
          .array[2];
  uVar10 = 0;
  uVar11 = 0;
  dVar2 = dVar2 * dVar2 + dVar13 * dVar13 + dVar12 * dVar12;
  local_f8._0_8_ = 1.0;
  local_b8._0_8_ = positionCom;
  local_a8 = velocityCom;
  if (dVar2 <= 9.999999999999999e-33) {
    local_e8 = ZEXT816(0);
    dVar2 = 0.0;
    uVar10 = 0;
    uVar11 = 0;
  }
  else {
    if (dVar2 < 0.0) {
      pVStack_100 = (Vector *)0x15d340;
      dVar2 = sqrt(dVar2);
      uVar10 = extraout_XMM0_Dc;
      uVar11 = extraout_XMM0_Dd;
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    auVar9._8_8_ = dVar2;
    auVar9._0_8_ = dVar2;
    local_e8 = divpd(*(undefined1 (*) [16])
                      (oriVector->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                      m_storage.m_data.array,auVar9);
    local_f8._0_8_ =
         (oriVector->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
         array[2] / dVar2;
  }
  local_88._8_4_ = uVar10;
  local_88._0_8_ = dVar2;
  local_88._12_4_ = uVar11;
  pVStack_100 = (Vector *)0x15d377;
  dVar2 = sin(dVar2);
  local_d8._0_8_ = (double)local_f8._0_8_ * dVar2;
  local_c8._8_4_ = SUB84(dVar2 * (double)local_e8._8_8_,0);
  local_c8._0_8_ = dVar2 * (double)local_e8._0_8_;
  local_c8._12_4_ = (int)((ulong)(dVar2 * (double)local_e8._8_8_) >> 0x20);
  pVStack_100 = (Vector *)0x15d3a1;
  dVar2 = cos((double)local_88._0_8_);
  dVar13 = 1.0 - dVar2;
  dVar14 = dVar13 * (double)local_e8._0_8_;
  dVar12 = (double)local_f8._0_8_ * dVar13 * (double)local_e8._8_8_;
  (this->op_).curRotation0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[0] = (double)local_e8._0_8_ * dVar14 + dVar2;
  (this->op_).curRotation0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[1] = (double)local_e8._8_8_ * dVar14 + (double)local_d8._0_8_;
  (this->op_).curRotation0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[2] = (double)local_f8._0_8_ * dVar14 - (double)local_c8._8_8_;
  (this->op_).curRotation0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[3] = (double)local_e8._8_8_ * dVar14 - (double)local_d8._0_8_;
  (this->op_).curRotation0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[4] = dVar13 * (double)local_e8._8_8_ * (double)local_e8._8_8_ + dVar2;
  (this->op_).curRotation0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[5] = dVar12 + (double)local_c8._0_8_;
  (this->op_).curRotation0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[6] = (double)local_c8._8_8_ + (double)local_f8._0_8_ * dVar14;
  (this->op_).curRotation0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[7] = dVar12 - (double)local_c8._0_8_;
  (this->op_).curRotation0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[8] = (double)local_f8._0_8_ * dVar13 * (double)local_f8._0_8_ + dVar2;
  velocityCom = local_a8;
  positionCom = (Vector3 *)local_b8._0_8_;
LAB_0015d4cf:
  mat = &(this->op_).rFlex;
  dVar2 = (this->op_).curRotation0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
          m_storage.m_data.array[1];
  (this->op_).rFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[0] = (this->op_).curRotation0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
             m_storage.m_data.array[0];
  (this->op_).rFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[1] = dVar2;
  dVar2 = (this->op_).curRotation0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
          m_storage.m_data.array[3];
  (this->op_).rFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[2] = (this->op_).curRotation0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
             m_storage.m_data.array[2];
  (this->op_).rFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[3] = dVar2;
  dVar2 = (this->op_).curRotation0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
          m_storage.m_data.array[5];
  (this->op_).rFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[4] = (this->op_).curRotation0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
             m_storage.m_data.array[4];
  (this->op_).rFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[5] = dVar2;
  dVar2 = (this->op_).curRotation0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
          m_storage.m_data.array[7];
  (this->op_).rFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[6] = (this->op_).curRotation0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
             m_storage.m_data.array[6];
  (this->op_).rFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[7] = dVar2;
  (this->op_).rFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[8] = (this->op_).curRotation0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
             m_storage.m_data.array[8];
  pVStack_158 = &(this->op_).linearAcceleration;
  pVStack_138 = &(this->op_).angularAcceleration;
  pVStack_108 = addiMoments;
  pVStack_110 = addiForces;
  pMStack_118 = (Matrix3 *)tm;
  pVStack_120 = fm;
  pVStack_128 = (Vector3 *)tc;
  pVStack_130 = fc;
  pVStack_140 = angularVel;
  pVStack_150 = oriVector;
  pVStack_160 = linVelocity;
  pVStack_168 = position;
  pIStack_170 = contactOri;
  pIStack_178 = contactPos;
  pMStack_180 = dotInertia;
  pMStack_188 = inertia;
  uStack_190 = 0x15d5a1;
  pMStack_148 = mat;
  (*(this->super_DynamicalSystemFunctorBase)._vptr_DynamicalSystemFunctorBase[10])
            (this,positionCom,velocityCom,accelerationCom,AngMomentum,dotAngMomentum);
  local_e8._8_8_ = 0;
  dVar14 = (double)local_98._0_8_ * 0.5 * (double)local_98._0_8_;
  dVar2 = (linVelocity->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
          m_data.array[1];
  dVar12 = (this->op_).linearAcceleration.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  dVar13 = (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
           .array[1];
  (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[0]
       = (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
         array[0] +
         (this->op_).linearAcceleration.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
         .m_storage.m_data.array[0] * dVar14 +
         (linVelocity->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
         m_data.array[0] * (double)local_98._0_8_;
  (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[1]
       = dVar13 + dVar12 * dVar14 + dVar2 * (double)local_98._0_8_;
  (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[2]
       = (this->op_).linearAcceleration.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
         .m_storage.m_data.array[2] * dVar14 +
         (linVelocity->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
         m_data.array[2] * (double)local_98._0_8_ +
         (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
         array[2];
  dVar2 = (this->op_).linearAcceleration.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  dVar12 = (linVelocity->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
           m_data.array[1];
  (linVelocity->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
  [0] = (linVelocity->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
        .array[0] +
        (this->op_).linearAcceleration.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
        m_storage.m_data.array[0] * (double)local_98._0_8_;
  (linVelocity->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
  [1] = dVar12 + dVar2 * (double)local_98._0_8_;
  (linVelocity->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
  [2] = (this->op_).linearAcceleration.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
        m_storage.m_data.array[2] * (double)local_98._0_8_ +
        (linVelocity->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
        .array[2];
  local_a8 = (Vector3 *)local_98._0_8_;
  dStack_a0 = (double)local_98._0_8_;
  local_f8._0_8_ =
       (this->op_).angularAcceleration.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
       m_storage.m_data.array[0] * dVar14 +
       (angularVel->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[0] * (double)local_98._0_8_;
  local_f8._8_8_ =
       (this->op_).angularAcceleration.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
       m_storage.m_data.array[1] * dVar14 +
       (angularVel->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[1] * (double)local_98._0_8_;
  local_e8._0_8_ =
       dVar14 * (this->op_).angularAcceleration.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
                [2] +
       (angularVel->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[2] * (double)local_98._0_8_;
  dVar2 = (double)local_e8._0_8_ * (double)local_e8._0_8_ +
          (double)local_f8._8_8_ * (double)local_f8._8_8_ +
          (double)local_f8._0_8_ * (double)local_f8._0_8_;
  if (dVar2 <= 9.999999999999999e-33) {
    dVar2 = 0.0;
    uVar10 = 0;
    uVar11 = 0;
    local_f8 = ZEXT816(0);
    local_e8 = ZEXT816(0x3ff0000000000000);
  }
  else {
    if (dVar2 < 0.0) {
      local_e8._8_8_ = 0;
      pVStack_100 = (Vector *)0x15d6fa;
      dVar2 = sqrt(dVar2);
      uVar10 = extraout_XMM0_Dc_00;
      uVar11 = extraout_XMM0_Dd_00;
    }
    else {
      uVar10 = 0;
      uVar11 = 0;
      dVar2 = SQRT(dVar2);
    }
    auVar6._8_4_ = SUB84(dVar2,0);
    auVar6._0_8_ = dVar2;
    auVar6._12_4_ = (int)((ulong)dVar2 >> 0x20);
    local_f8 = divpd(local_f8,auVar6);
    local_e8._0_8_ = (double)local_e8._0_8_ / dVar2;
  }
  local_d8._8_4_ = uVar10;
  local_d8._0_8_ = dVar2;
  local_d8._12_4_ = uVar11;
  pVStack_100 = (Vector *)0x15d733;
  dVar2 = sin(dVar2);
  local_c8._0_8_ = (double)local_e8._0_8_ * dVar2;
  local_b8._8_4_ = SUB84(dVar2 * (double)local_f8._8_8_,0);
  local_b8._0_8_ = dVar2 * (double)local_f8._0_8_;
  local_b8._12_4_ = (int)((ulong)(dVar2 * (double)local_f8._8_8_) >> 0x20);
  pVStack_100 = (Vector *)0x15d75d;
  dVar2 = cos((double)local_d8._0_8_);
  dVar13 = 1.0 - dVar2;
  dVar14 = dVar13 * (double)local_f8._0_8_;
  dVar12 = (double)local_e8._0_8_ * dVar13 * (double)local_f8._8_8_;
  lVar8 = 0x568;
  do {
    dVar3 = *(double *)((long)this + lVar8 + -0x10);
    dVar4 = *(double *)((long)this + lVar8 + -8);
    dVar5 = *(double *)
             ((long)&(this->super_DynamicalSystemFunctorBase)._vptr_DynamicalSystemFunctorBase +
             lVar8);
    *(double *)((long)adStack_5e0 + lVar8) =
         dVar5 * ((double)local_b8._8_8_ + (double)local_e8._0_8_ * dVar14) +
         dVar4 * ((double)local_f8._8_8_ * dVar14 - (double)local_c8._0_8_) +
         dVar3 * ((double)local_f8._0_8_ * dVar14 + dVar2);
    *(double *)((long)adStack_5e0 + lVar8 + 8) =
         dVar5 * (dVar12 - (double)local_b8._0_8_) +
         dVar4 * (dVar13 * (double)local_f8._8_8_ * (double)local_f8._8_8_ + dVar2) +
         dVar3 * ((double)local_f8._8_8_ * dVar14 + (double)local_c8._0_8_);
    *(double *)((long)adStack_5e0 + lVar8 + 0x10) =
         dVar5 * ((double)local_e8._0_8_ * dVar13 * (double)local_e8._0_8_ + dVar2) +
         (dVar12 + (double)local_b8._0_8_) * dVar4 +
         ((double)local_e8._0_8_ * dVar14 - (double)local_b8._8_8_) * dVar3;
    lVar8 = lVar8 + 0x18;
  } while (lVar8 != 0x5b0);
  (this->op_).rFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[0] = tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
             [0];
  (this->op_).rFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[1] = tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
             [1];
  (this->op_).rFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[2] = tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
             [2];
  (this->op_).rFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[3] = tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
             [3];
  (this->op_).rFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[4] = tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
             [4];
  (this->op_).rFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[5] = tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
             [5];
  (this->op_).rFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[6] = tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
             [6];
  (this->op_).rFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[7] = tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
             [7];
  (this->op_).rFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[8] = tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
             [8];
  dVar2 = (angularVel->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
          m_data.array[1] +
          dStack_a0 *
          (this->op_).angularAcceleration.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  auVar7._8_4_ = SUB84(dVar2,0);
  auVar7._0_8_ = (angularVel->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                 m_storage.m_data.array[0] +
                 (double)local_a8 *
                 (this->op_).angularAcceleration.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
                 [0];
  auVar7._12_4_ = (int)((ulong)dVar2 >> 0x20);
  *(undefined1 (*) [16])
   (angularVel->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
       = auVar7;
  (angularVel->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
  [2] = (double)local_98._0_8_ *
        (this->op_).angularAcceleration.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
        .m_storage.m_data.array[2] +
        (angularVel->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
        array[2];
  pVStack_100 = (Vector *)0x15d941;
  Eigen::AngleAxis<double>::operator=
            (&(this->op_).orientationAA,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)mat);
  dVar2 = (this->op_).orientationAA.m_angle;
  dVar12 = (this->op_).orientationAA.m_axis.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  (oriVector->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
  [0] = dVar2 * (this->op_).orientationAA.m_axis.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
                [0];
  (oriVector->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
  [1] = dVar2 * dVar12;
  (oriVector->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
  [2] = dVar2 * (this->op_).orientationAA.m_axis.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
                [2];
  if (this->contactModel_ == 2) {
    pVStack_108 = (Vector3 *)tc;
    pVStack_110 = (Vector3 *)fc;
    pMStack_118 = (Matrix3 *)angularVel;
    pVStack_120 = (Vector3 *)0x15da0a;
    (*(this->super_DynamicalSystemFunctorBase)._vptr_DynamicalSystemFunctorBase[0x18])
              (this,contactPos,position,linVelocity,oriVector,mat);
  }
  else {
    if (this->contactModel_ != 1) {
      pVStack_100 = (Vector *)0x15da26;
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      pVStack_100 = (Vector *)0x15da38;
      std::invalid_argument::invalid_argument
                (this_00,
                 "IMUElasticLocalFrameDynamicalSystem: the contact model is incorrectly set.");
      pVStack_100 = (Vector *)&LAB_0015da4e;
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    pVStack_100 = tc;
    pVStack_108 = (Vector3 *)fc;
    pVStack_110 = angularVel;
    pVStack_120 = oriVector;
    pVStack_128 = linVelocity;
    pVStack_130 = (Vector *)0x15d9c8;
    pMStack_118 = mat;
    (*(this->super_DynamicalSystemFunctorBase)._vptr_DynamicalSystemFunctorBase[0x17])
              (this,contactPos,contactOri,&(this->op_).contactVelArray,
               &(this->op_).contactAngVelArray,position);
  }
  return;
}

Assistant:

void IMUElasticLocalFrameDynamicalSystem::iterateDynamicsEuler(const Vector3 & positionCom,
                                                               const Vector3 & velocityCom,
                                                               const Vector3 & accelerationCom,
                                                               const Vector3 & AngMomentum,
                                                               const Vector3 & dotAngMomentum,
                                                               const Matrix3 & inertia,
                                                               const Matrix3 & dotInertia,
                                                               const IndexedVectorArray & contactPos,
                                                               const IndexedVectorArray & contactOri,
                                                               Vector3 & position,
                                                               Vector3 & linVelocity,
                                                               Vector & fc,
                                                               Vector3 & oriVector,
                                                               Vector3 & angularVel,
                                                               Vector & tc,
                                                               const Vector3 & fm,
                                                               const Vector3 & tm,
                                                               const Vector3 & addiForces,
                                                               const Vector3 & addiMoments,
                                                               double dt)
{

  op_.rFlex = computeRotation_(oriVector, 0);
  // compute new acceleration with the current flex position and velocity and input

  //        computeForcesAndMoments (contactPos, contactOri, op_.contactVelArray, op_.contactAngVelArray,
  //                          position, linVelocity, oriVector, op_.rFlex,
  //                             angularVel, fc, tc);

  computeAccelerations(positionCom, velocityCom, accelerationCom, AngMomentum, dotAngMomentum, inertia, dotInertia,
                       contactPos, contactOri, position, linVelocity, op_.linearAcceleration, oriVector, op_.rFlex,
                       angularVel, op_.angularAcceleration, fc, tc, fm, tm, addiForces, addiMoments);

  /// integrate kinematics with the last acceleration
  kine::integrateKinematics(position, linVelocity, op_.linearAcceleration, op_.rFlex, angularVel,
                            op_.angularAcceleration, dt);

  /// Adding a kinematic coupling to improve estimation of the velocities
  //        Vector3 constrainedLinVel;
  //        constrainedLinVel.setZero();
  //
  //        for(int i=0; i<getContactsNumber();++i)
  //        {
  //          constrainedLinVel += Vector3(op_.rFlex*contactPos[i]).cross(angularVel);
  //        }
  //        constrainedLinVel=constrainedLinVel/getContactsNumber();
  //
  //        double alphaLin=0.1; ///kinematic coupling weight
  //        linVelocity=alphaLin*linVelocity + (1-alphaLin) * constrainedLinVel;
  //        ///
  //
  //        Vector3 constrainedAngVel=angularVel;
  //        if (getContactsNumber()==2)
  //        {
  //
  //            Vector3 interlegAxis = contactPos[1]-contactPos[0];
  //            constrainedAngVel -= (angularVel.dot(interlegAxis) * interlegAxis)/interlegAxis.squaredNorm();
  //        }
  //        else if (getContactsNumber()>2)
  //        {
  //            constrainedAngVel.setZero();
  //        }
  //        double alphaAng = 0.1;
  //        angularVel = alphaAng*angularVel + (1-alphaAng)*constrainedAngVel;

  op_.orientationAA = op_.rFlex;
  oriVector.noalias() = op_.orientationAA.angle() * op_.orientationAA.axis();

  computeForcesAndMoments(contactPos, contactOri, op_.contactVelArray, op_.contactAngVelArray, position, linVelocity,
                          oriVector, op_.rFlex, angularVel, fc, tc);
}